

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall qpdf::Stream::warn(Stream *this,string *message)

{
  element_type *peVar1;
  QPDF *this_00;
  qpdf_offset_t offset;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *message_local;
  Stream *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  peVar1 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  this_00 = QPDFObject::getQPDF(peVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  peVar1 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  offset = QPDFObject::getParsedOffset(peVar1);
  QPDF::warn(this_00,qpdf_e_damaged_pdf,&local_38,offset,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void
Stream::warn(std::string const& message)
{
    obj->getQPDF()->warn(qpdf_e_damaged_pdf, "", obj->getParsedOffset(), message);
}